

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_Blit(GPU_Image *image,GPU_Rect *src_rect,GPU_Target *target,float x,float y)

{
  float y_local;
  float x_local;
  GPU_Target *target_local;
  GPU_Rect *src_rect_local;
  GPU_Image *image_local;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    GPU_PushErrorCode("GPU_Blit",GPU_ERROR_USER_ERROR,"%s","NULL renderer");
  }
  else {
    if (((_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) &&
        (target != (GPU_Target *)0x0)) && (target->context != (GPU_Context *)0x0)) {
      GPU_MakeCurrent(target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) {
      GPU_PushErrorCode("GPU_Blit",GPU_ERROR_USER_ERROR,"%s","NULL context");
    }
    else if (image == (GPU_Image *)0x0) {
      GPU_PushErrorCode("GPU_Blit",GPU_ERROR_NULL_ARGUMENT,"%s","image");
    }
    else if (target == (GPU_Target *)0x0) {
      GPU_PushErrorCode("GPU_Blit",GPU_ERROR_NULL_ARGUMENT,"%s","target");
    }
    else {
      (*_gpu_current_renderer->impl->Blit)(_gpu_current_renderer,image,src_rect,target,x,y);
    }
  }
  return;
}

Assistant:

void GPU_Blit(GPU_Image* image, GPU_Rect* src_rect, GPU_Target* target, float x, float y)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    if(image == NULL)
        RETURN_ERROR(GPU_ERROR_NULL_ARGUMENT, "image");
    if(target == NULL)
        RETURN_ERROR(GPU_ERROR_NULL_ARGUMENT, "target");

    _gpu_current_renderer->impl->Blit(_gpu_current_renderer, image, src_rect, target, x, y);
}